

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall
fixedMeasurement_powroot_Test::~fixedMeasurement_powroot_Test(fixedMeasurement_powroot_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedMeasurement, powroot)
{
    fixed_measurement m1(2.0, m);

    auto v1 = pow(m1, 3);
    EXPECT_EQ(v1.value(), 8.0);
    EXPECT_EQ(v1.units(), m.pow(3));
#ifndef UNITS_HEADER_ONLY
    auto m2 = root(v1, 3);
    EXPECT_TRUE(m2 == m1);

    fixed_measurement m4(16.0, m.pow(2));
    EXPECT_TRUE(sqrt(m4) == fixed_measurement(4.0, m));
#endif
}